

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O3

bool __thiscall
r_exec::_Mem::load(_Mem *this,vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *objects,
                  uint64_t stdin_oid,uint64_t stdout_oid,uint64_t self_oid)

{
  atomic_int_fast64_t *paVar1;
  pointer *pppGVar2;
  Code *pCVar3;
  iterator iVar4;
  Group *object;
  _Hash_node_base this_00;
  char cVar5;
  uchar uVar6;
  bool bVar7;
  short sVar8;
  undefined2 uVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ModelBase *this_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Group *this_02;
  Code **ppCVar12;
  pointer ppCVar13;
  __node_base *p_Var14;
  Code *object_00;
  ulong uVar15;
  Group *local_70;
  Code **local_68;
  uint64_t local_60;
  Code **local_58;
  uint64_t local_50;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *local_48;
  vector<r_exec::Group*,std::allocator<r_exec::Group*>> *local_40;
  uint64_t local_38;
  
  local_38 = stdin_oid;
  r_code::Utils::SetReferenceValues
            (this->base_period,this->float_tolerance,
             ((double)CONCAT44(0x45300000,(int)(this->time_tolerance >> 0x20)) -
             1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->time_tolerance) - 4503599627370496.0));
  pCVar3 = *(objects->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  object_00 = (Code *)(this->_root).object;
  if (object_00 != pCVar3) {
    if (object_00 != (Code *)0x0) {
      LOCK();
      paVar1 = &(object_00->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((object_00->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
        (*(object_00->super__Object)._vptr__Object[1])(object_00);
      }
    }
    (this->_root).object = &pCVar3->super__Object;
    if (pCVar3 == (Code *)0x0) {
      object_00 = (Code *)0x0;
    }
    else {
      LOCK();
      paVar1 = &(pCVar3->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      object_00 = (Code *)(this->_root).object;
    }
  }
  store(this,object_00);
  local_40 = (vector<r_exec::Group*,std::allocator<r_exec::Group*>> *)&this->initial_groups;
  local_70 = (Group *)(this->_root).object;
  iVar4._M_current =
       (this->initial_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->initial_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<r_exec::Group*,std::allocator<r_exec::Group*>>::_M_realloc_insert<r_exec::Group*>
              (local_40,iVar4,&local_70);
  }
  else {
    *iVar4._M_current = local_70;
    pppGVar2 = &(this->initial_groups).
                super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppGVar2 = *pppGVar2 + 1;
  }
  (**(code **)(*(long *)this + 0x10))
            (this,((long)(objects->
                         super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(objects->
                         super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3) + -1);
  ppCVar13 = (objects->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(objects->
                        super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish - (long)ppCVar13)) {
    local_68 = &this->_self;
    local_58 = &this->_stdout;
    uVar15 = 1;
    local_60 = self_oid;
    local_50 = stdout_oid;
    local_48 = objects;
    do {
      object = (Group *)ppCVar13[uVar15];
      store(this,(Code *)object);
      iVar10 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                 super_LObject.super_Code.super__Object._vptr__Object[2])(object);
      ppCVar12 = &this->_stdin;
      if (((CONCAT44(extraout_var,iVar10) == local_38) ||
          (iVar10 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                      super_LObject.super_Code.super__Object._vptr__Object[2])(object),
          ppCVar12 = local_58, CONCAT44(extraout_var_00,iVar10) == local_50)) ||
         (iVar10 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                     super_LObject.super_Code.super__Object._vptr__Object[2])(object),
         ppCVar12 = local_68, CONCAT44(extraout_var_01,iVar10) == local_60)) {
        *ppCVar12 = (objects->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar15];
      }
      (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(object,0);
      cVar5 = r_code::Atom::getDescriptor();
      if (cVar5 == -0x37) {
        iVar10 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                   super_LObject.super_Code.super__Object._vptr__Object[9])(object,0);
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar10) + 0x20))
                  ((long *)CONCAT44(extraout_var_02,iVar10),0);
        sVar8 = r_code::Atom::asOpcode();
        if (sVar8 == Opcodes::Pgm) {
          iVar10 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                     super_LObject.super_Code.super__Object._vptr__Object[9])(object,0);
          iVar11 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                     super_LObject.super_Code.super__Object._vptr__Object[9])(object,0);
          (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar11) + 0x20))
                    ((long *)CONCAT44(extraout_var_04,iVar11),2);
          uVar9 = r_code::Atom::asIndex();
          (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar10) + 0x20))
                    ((long *)CONCAT44(extraout_var_03,iVar10),uVar9);
          cVar5 = r_code::Atom::getAtomCount();
          if (cVar5 != '\0') goto LAB_00187548;
          (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(object,0);
          uVar6 = r_code::Atom::asOpcode();
          (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(object,0);
          r_code::Atom::getAtomCount();
          r_code::Atom::InstantiatedInputLessProgram((ushort)(Atom *)&local_70,uVar6);
          iVar10 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                     super_LObject.super_Code.super__Object._vptr__Object[4])(object,0);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar10),(Atom *)&local_70);
        }
        else {
          (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(object,0);
          uVar6 = r_code::Atom::asOpcode();
          (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(object,0);
          r_code::Atom::getAtomCount();
          r_code::Atom::InstantiatedAntiProgram((ushort)(Atom *)&local_70,uVar6);
          iVar10 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                     super_LObject.super_Code.super__Object._vptr__Object[4])(object,0);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar10),(Atom *)&local_70);
        }
        r_code::Atom::~Atom((Atom *)&local_70);
      }
      else if (cVar5 == -0x33) {
        unpack_hlp(this,(Code *)object);
      }
      else if (cVar5 == -0x32) {
        unpack_hlp(this,(Code *)object);
        this_01 = ModelBase::Get();
        ModelBase::load(this_01,(Code *)object);
      }
LAB_00187548:
      p_Var14 = &(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                 super_LObject.super_Code.views._M_h._M_before_begin;
      while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
        this_00._M_nxt = p_Var14[1]._M_nxt;
        r_exec::View::set_object((View *)this_00._M_nxt,(Code *)object);
        this_02 = r_exec::View::get_host((View *)this_00._M_nxt);
        bVar7 = Group::load(this_02,(View *)this_00._M_nxt,(Code *)object);
        if (!bVar7) {
          return false;
        }
      }
      (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(object,0);
      cVar5 = r_code::Atom::getDescriptor();
      objects = local_48;
      if (cVar5 == -0x38) {
        iVar4._M_current =
             (this->initial_groups).
             super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_70 = object;
        if (iVar4._M_current ==
            (this->initial_groups).
            super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<r_exec::Group*,std::allocator<r_exec::Group*>>::
          _M_realloc_insert<r_exec::Group*>(local_40,iVar4,&local_70);
        }
        else {
          *iVar4._M_current = object;
          pppGVar2 = &(this->initial_groups).
                      super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppGVar2 = *pppGVar2 + 1;
        }
      }
      uVar15 = uVar15 + 1;
      ppCVar13 = (objects->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(objects->
                                    super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar13 >>
                             3));
  }
  return true;
}

Assistant:

bool _Mem::load(std::vector<r_code::Code *> *objects, uint64_t stdin_oid, uint64_t stdout_oid, uint64_t self_oid)
{
    Utils::SetReferenceValues(base_period, float_tolerance, time_tolerance);
    // load root (always comes first).
    _root = (Group *)(*objects)[0];
    store((Code *)_root);
    initial_groups.push_back(_root);
    set_last_oid(objects->size() - 1);

    for (uint64_t i = 1; i < objects->size(); ++i) { // skip root as it has no initial views.
        Code *object = (*objects)[i];
        store(object);

        if (object->get_oid() == stdin_oid) {
            _stdin = (Group *)(*objects)[i];
        } else if (object->get_oid() == stdout_oid) {
            _stdout = (Group *)(*objects)[i];
        } else if (object->get_oid() == self_oid) {
            _self = (*objects)[i];
        }

        switch (object->code(0).getDescriptor()) {
        case Atom::MODEL:
            unpack_hlp(object);
            //object->add_reference(NULL); // classifier.
            ModelBase::Get()->load(object);
            break;

        case Atom::COMPOSITE_STATE:
            unpack_hlp(object);
            break;

        case Atom::INSTANTIATED_PROGRAM: // refine the opcode depending on the inputs and the program type.
            if (object->get_reference(0)->code(0).asOpcode() == Opcodes::Pgm) {
                if (object->get_reference(0)->code(object->get_reference(0)->code(PGM_INPUTS).asIndex()).getAtomCount() == 0) {
                    object->code(0) = Atom::InstantiatedInputLessProgram(object->code(0).asOpcode(), object->code(0).getAtomCount());
                }
            } else {
                object->code(0) = Atom::InstantiatedAntiProgram(object->code(0).asOpcode(), object->code(0).getAtomCount());
            }

            break;
        }

        std::unordered_set<r_code::View *, r_code::View::Hash, r_code::View::Equal>::const_iterator v;

        for (v = object->views.begin(); v != object->views.end(); ++v) {
            // init hosts' member_set.
            View *view = (r_exec::View *)*v;
            view->set_object(object);
            Group *host = view->get_host();

            if (!host->load(view, object)) {
                return false;
            }
        }

        if (object->code(0).getDescriptor() == Atom::GROUP) {
            initial_groups.push_back((Group *)object);    // convenience to create initial update jobs - see start().
        }
    }

    return true;
}